

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O2

uint __thiscall kj::_::HashCoder::operator*(HashCoder *this,ArrayPtr<const_kj::String> arr)

{
  uint uVar1;
  String *e;
  uint uVar2;
  String *value;
  long lVar3;
  
  value = arr.ptr;
  uVar2 = (int)arr.size_ * 4;
  for (lVar3 = arr.size_ * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    uVar1 = hashCode<kj::String_const&>(value);
    uVar2 = uVar2 * 0x5bd1e995 ^ (uVar1 * 0x5bd1e995 >> 0x18 ^ uVar1 * 0x5bd1e995) * 0x5bd1e995;
    value = value + 1;
  }
  uVar2 = (uVar2 >> 0xd ^ uVar2) * 0x5bd1e995;
  return uVar2 >> 0xf ^ uVar2;
}

Assistant:

inline uint HashCoder::operator*(ArrayPtr<T> arr) const {
  // Hash each array element to create a string of hashes, then murmur2 over those.
  //
  // TODO(perf): Choose a more-modern hash. (See hash.c++.)

  constexpr uint m = 0x5bd1e995;
  constexpr uint r = 24;
  uint h = arr.size() * sizeof(uint);

  for (auto& e: arr) {
    uint k = kj::hashCode(e);
    k *= m;
    k ^= k >> r;
    k *= m;
    h *= m;
    h ^= k;
  }

  h ^= h >> 13;
  h *= m;
  h ^= h >> 15;
  return h;
}